

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

bool __thiscall catalog::createIndex(catalog *this,IndexInfo *indexinfo)

{
  string *__y;
  __type _Var1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  iterator iVar4;
  iterator iVar5;
  int i;
  ulong uVar6;
  TableInfo *pTVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  _Base_ptr __k;
  _Self __tmp;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  
  __y = &indexinfo->indexName;
  uVar10 = 0xffffffffffffffff;
  for (uVar6 = 0; (long)uVar6 < (long)this->tableNumber; uVar6 = uVar6 + 1) {
    pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar6];
    p_Var2 = *(_Base_ptr *)((long)&(pTVar7->indexInfo)._M_t._M_impl + 0x18);
    while ((_Rb_tree_header *)p_Var2 !=
           (_Rb_tree_header *)((long)&(pTVar7->indexInfo)._M_t._M_impl + 8U)) {
      _Var1 = std::operator==(__y,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_Var2[1]._M_parent);
      if (_Var1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"index ");
        poVar3 = std::operator<<(poVar3,(string *)__y);
        poVar3 = std::operator<<(poVar3," already exists in ");
        pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6];
        goto LAB_00121a0c;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
    }
    _Var1 = std::operator==(&pTVar7->tableName,&indexinfo->tableName);
    if (_Var1) {
      uVar10 = uVar6;
    }
    uVar10 = uVar10 & 0xffffffff;
  }
  poVar3 = (ostream *)&std::cout;
  iVar9 = (int)uVar10;
  if (iVar9 == -1) {
    pcVar8 = "can not find table in list";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"i find table in list");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&((this->TableInfoList).
                     super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9]->getID)._M_t,&indexinfo->colunmName);
    pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar9];
    if (iVar4._M_node != (_Base_ptr)((long)&(pTVar7->getID)._M_t._M_impl + 8U)) {
      __k = iVar4._M_node + 2;
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(pTVar7->indexInfo)._M_t,__k);
      pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar9];
      if (iVar5._M_node == (_Base_ptr)((long)&(pTVar7->indexInfo)._M_t._M_impl + 8U)) {
        *(undefined4 *)
         (*(long *)&(pTVar7->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + (long)(int)__k->_M_color * 4) = 4;
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&p,(int *)__k,__y);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)&(this->TableInfoList).
                       super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar9]->indexInfo,&p);
        poVar3 = std::operator<<((ostream *)&std::cout,"create index ");
        poVar3 = std::operator<<(poVar3,(string *)__y);
        std::endl<char,std::char_traits<char>>(poVar3);
        if (this->anychangeornot == false) {
          this->anychangeornot = true;
        }
        std::__cxx11::string::~string((string *)&p.second);
        return true;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"index already exists in ");
      pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar9];
LAB_00121a0c:
      poVar3 = std::operator<<(poVar3,(string *)pTVar7);
      goto LAB_00121a14;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"can not find colunm ");
    poVar3 = std::operator<<(poVar3,(string *)&indexinfo->colunmName);
    pcVar8 = " in list";
  }
  poVar3 = std::operator<<(poVar3,pcVar8);
LAB_00121a14:
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool catalog::createIndex(IndexInfo *indexinfo){
    int pos = -1;
    for(int i = 0 ; i < tableNumber ; i ++){
        std::map<int,std::string>::iterator it;
        it = TableInfoList[i]->indexInfo.begin();
        while(it != TableInfoList[i]->indexInfo.end())
        {
            //检查每个表上indexName是否被占用
            // std::cout << it->second <<std::endl;
            // if(indexinfo->indexID == TableInfoList[])
            if(indexinfo->indexName == it->second){
                 std::cout<<"index "<<indexinfo->indexName <<" already exists in "<<TableInfoList[i]->tableName<<std::endl;
                 return false;
            }
            it ++;         
        }
        //
        if(TableInfoList[i]->tableName == indexinfo->tableName){
            pos = i;
        }
    }

    //
    if(pos == -1){
        std::cout<<"can not find table in list"<<std::endl;
        return false;
    }
    std::cout<<"i find table in list"<<std::endl;
    auto it = TableInfoList[pos]->getID.find(indexinfo->colunmName);
    if(it!=TableInfoList[pos]->getID.end()){
        //这个列名存在
        auto x = TableInfoList[pos]->indexInfo.find(it->second);
        if(x!=TableInfoList[pos]->indexInfo.end()){
            //这个列已经被建立索引
            std::cout<<"index already exists in "<<TableInfoList[pos]->tableName<<std::endl;
            return false;
        }

    }else{
        std::cout<<"can not find colunm "<<indexinfo->colunmName <<" in list"<<std::endl;
        return false;
    }
    //先修改constraint
    TableInfoList[pos]->constraint[it->second] = 4;
    //修改indexInfo
    std::pair<int,std::string> p = std::make_pair(it->second, indexinfo->indexName);      
    TableInfoList[pos]->indexInfo.insert(p);
    std::cout<<"create index "<<indexinfo->indexName<<std::endl;
    if(!anychangeornot)anychangeornot = true;
    return true;
}